

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_write_tile_obu_mt
               (AV1_COMP *cpi,uint8_t *dst,uint32_t *total_size,aom_write_bit_buffer *saved_wb,
               uint8_t obu_extn_header,FrameHeaderInfo *fh_info,int *largest_tile_id,
               uint *max_tile_size,uint32_t *obu_header_size,uint8_t **tile_data_start,
               int num_workers)

{
  ThreadData *__src;
  PackBSTileOrder *__s;
  TileDataEnc *pTVar1;
  EncWorkerData *pEVar2;
  AVxWorker *pAVar3;
  long lVar4;
  uint16_t *puVar5;
  AVxWorkerInterface *pAVar6;
  AVxWorker *pAVar7;
  uint64_t *puVar8;
  int iVar9;
  uint8_t *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  ThreadData *td;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  uint8_t *puVar23;
  long lVar24;
  bool bVar25;
  uint uVar26;
  uint32_t *__s_00;
  PackBSParams *pack_bs_params_00;
  bool bVar27;
  uint8_t *local_d098;
  uint local_d08c;
  MACROBLOCKD *local_d088;
  uint8_t *local_d080;
  ulong local_d078;
  ulong local_d070;
  ulong local_d068;
  ulong local_d060;
  uint *local_d058;
  ulong local_d050;
  FrameHeaderInfo *local_d048;
  long local_d040;
  int tg_size_mi [512];
  size_t tg_buf_size [512];
  uint32_t tile_size [512];
  PackBSParams pack_bs_params [512];
  
  __s_00 = tile_size;
  local_d080 = dst;
  local_d058 = total_size;
  local_d048 = fh_info;
  memset(__s_00,0,0x800);
  lVar4 = 6;
  do {
    *(uint32_t **)((long)&pack_bs_params[0].saved_wb + lVar4 * 4) = __s_00;
    __s_00 = __s_00 + 1;
    lVar4 = lVar4 + 0x16;
  } while (lVar4 != 0x2c06);
  uVar26 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  uVar13 = (ulong)uVar26;
  uVar20 = cpi->num_tg;
  uVar22 = (ulong)uVar20;
  iVar9 = (int)(uVar26 + uVar20 + -1) / (int)uVar20;
  memset(tg_size_mi,0,0x800);
  if (0 < (int)uVar26) {
    pTVar1 = cpi->tile_data;
    uVar12 = 1;
    piVar14 = &pack_bs_params[0].new_tg;
    lVar4 = 0;
    uVar15 = 0;
    iVar16 = 0;
    do {
      iVar19 = (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x32 + lVar4) -
               *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x2e + lVar4)) *
               (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3a + lVar4) -
               *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x36 + lVar4));
      iVar16 = iVar16 + 1;
      bVar27 = (ulong)(uVar26 - 1) * 0x5d10 - lVar4 == 0;
      bVar25 = bVar27 || iVar16 == iVar9;
      *(uint8_t *)(piVar14 + -7) = obu_extn_header;
      ((PackBSParams *)(piVar14 + -0x15))->saved_wb = saved_wb;
      *(undefined8 *)(piVar14 + -6) = 0;
      uVar11 = (uint)bVar25;
      piVar14[-1] = uVar11;
      *piVar14 = uVar12;
      *(undefined8 *)(piVar14 + -3) =
           *(undefined8 *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3e + lVar4);
      piVar14[-4] = iVar19;
      tg_size_mi[uVar15] = tg_size_mi[uVar15] + iVar19;
      if (bVar27 || iVar16 == iVar9) {
        iVar16 = 0;
      }
      uVar15 = uVar15 + uVar11;
      lVar4 = lVar4 + 0x5d10;
      piVar14 = piVar14 + 0x16;
      uVar12 = (uint)bVar25;
    } while (uVar13 * 0x5d10 - lVar4 != 0);
  }
  iVar16 = 0;
  local_d068 = uVar13;
  local_d060 = uVar13;
  memset(tg_buf_size,0,0x1000);
  local_d098 = (uint8_t *)cpi->available_bs_size;
  puVar23 = local_d080;
  local_d078 = (ulong)local_d098;
  if (0 < (int)uVar20) {
    local_d088 = &(cpi->td).mb.e_mbd;
    local_d050 = (long)(cpi->common).mi_params.mi_rows * (long)(cpi->common).mi_params.mi_cols;
    local_d040 = (long)iVar9 * 0x58;
    pack_bs_params_00 = pack_bs_params;
    uVar13 = 0;
    local_d070 = CONCAT44(local_d070._4_4_,iVar9);
    puVar10 = local_d098;
    do {
      if (uVar13 == (int)uVar22 - 1) {
        local_d098 = (uint8_t *)0x0;
        uVar22 = (ulong)puVar10;
      }
      else {
        uVar22 = ((long)tg_size_mi[uVar13] * local_d078) / local_d050;
        local_d098 = (uint8_t *)((long)puVar10 - uVar22);
      }
      pack_bs_params_00->dst = puVar23;
      pack_bs_params_00->tile_data_curr = puVar23;
      av1_write_obu_tg_tile_headers(cpi,local_d088,pack_bs_params_00,iVar16);
      puVar23 = puVar23 + uVar22;
      tg_buf_size[uVar13] = uVar22 - (long)pack_bs_params_00->curr_tg_hdr_size;
      uVar13 = uVar13 + 1;
      uVar22 = (ulong)cpi->num_tg;
      iVar16 = iVar16 + (int)local_d070;
      pack_bs_params_00 = (PackBSParams *)((long)&pack_bs_params_00->saved_wb + local_d040);
      puVar10 = local_d098;
    } while ((long)uVar13 < (long)uVar22);
  }
  if (0 < (int)local_d060) {
    lVar4 = 0;
    uVar13 = 0;
    puVar10 = local_d080;
    uVar22 = local_d078;
    do {
      iVar9 = *(int *)((long)&pack_bs_params[0].new_tg + lVar4);
      uVar17 = (ulong)local_d098;
      if (iVar9 != 0) {
        uVar17 = tg_buf_size[uVar13];
        uVar22 = uVar17;
      }
      iVar16 = *(int *)((long)&pack_bs_params[0].is_last_tile_in_tg + lVar4);
      if (iVar16 == 0) {
        uVar18 = ((long)*(int *)((long)&pack_bs_params[0].tile_size_mi + lVar4) * uVar22) /
                 (ulong)(long)tg_size_mi[uVar13];
        local_d098 = (uint8_t *)(uVar17 - uVar18);
      }
      else {
        local_d098 = (uint8_t *)0x0;
        uVar18 = uVar17;
      }
      *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar4) = uVar18;
      if (iVar9 == 0) {
        *(uint8_t **)((long)&pack_bs_params[0].dst + lVar4) = puVar23;
        *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar4) = puVar10;
      }
      else {
        puVar23 = *(uint8_t **)((long)&pack_bs_params[0].dst + lVar4);
        puVar10 = *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar4);
        uVar18 = uVar18 + (long)*(int *)((long)&pack_bs_params[0].curr_tg_hdr_size + lVar4);
        *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar4) = uVar18;
      }
      uVar13 = (ulong)(((int)uVar13 + 1) - (uint)(iVar16 == 0));
      puVar23 = puVar23 + uVar18;
      lVar4 = lVar4 + 0x58;
    } while (local_d068 * 0x58 - lVar4 != 0);
  }
  local_d088 = (MACROBLOCKD *)(ulong)(uint)num_workers;
  if (0 < num_workers) {
    __src = &cpi->td;
    uVar22 = (long)local_d088 + 1;
    lVar21 = (long)local_d088 * 0x38;
    lVar4 = (long)local_d088 * 0x1d0;
    do {
      pAVar7 = (cpi->mt_info).workers;
      pEVar2 = (cpi->mt_info).tile_thr_data;
      if (uVar22 == 2) {
        *(ThreadData **)(pEVar2[-1].error_info.detail + lVar4 + -0x18) = __src;
        td = __src;
      }
      else {
        td = *(ThreadData **)(pEVar2[-1].error_info.detail + lVar4 + -0x10);
        *(ThreadData **)(pEVar2[-1].error_info.detail + lVar4 + -0x18) = td;
        if (td != __src) {
          memcpy(td,__src,0x256b0);
          td = *(ThreadData **)(pEVar2[-1].error_info.detail + lVar4 + -0x18);
        }
      }
      *(AV1_COMP **)(pEVar2[-1].error_info.detail + lVar4 + -0x20) = cpi;
      uVar22 = uVar22 - 1;
      iVar9 = (int)uVar22 + -1;
      *(int *)((long)&pEVar2[-1].start + lVar4) = iVar9;
      *(int *)((long)&pEVar2[-1].thread_id + lVar4) = iVar9;
      av1_reset_pack_bs_thread_data(td);
      *(code **)((long)pAVar7 + lVar21 + -0x20) = pack_bs_worker_hook;
      *(char **)((long)pAVar7 + lVar21 + -0x18) = pEVar2[-1].error_info.detail + lVar4 + -0x20;
      *(PackBSParams **)((long)pAVar7 + lVar21 + -0x10) = pack_bs_params;
      lVar21 = lVar21 + -0x38;
      lVar4 = lVar4 + -0x1d0;
    } while (1 < uVar22);
  }
  iVar9 = (cpi->common).tiles.cols;
  iVar16 = (cpi->common).tiles.rows;
  (cpi->mt_info).pack_bs_sync.next_job_idx = 0;
  (cpi->mt_info).pack_bs_sync.pack_bs_mt_exit = false;
  __s = (cpi->mt_info).pack_bs_sync.pack_bs_tile_order;
  uVar20 = iVar9 * iVar16 & 0xffff;
  memset(__s,0,(ulong)(uVar20 << 4));
  if (uVar20 != 0) {
    puVar5 = &(cpi->mt_info).pack_bs_sync.pack_bs_tile_order[0].tile_idx;
    puVar8 = &cpi->tile_data->abs_sum_level;
    uVar22 = 0;
    do {
      ((PackBSTileOrder *)(puVar5 + -4))->abs_sum_level = *puVar8;
      *puVar5 = (uint16_t)uVar22;
      uVar22 = uVar22 + 1;
      puVar5 = puVar5 + 8;
      puVar8 = puVar8 + 0xba2;
    } while (uVar20 != uVar22);
  }
  qsort(__s,(ulong)uVar20,0x10,compare_tile_order);
  pAVar6 = aom_get_worker_interface();
  if (0 < num_workers) {
    lVar4 = (long)local_d088 - 1;
    pAVar3 = (cpi->mt_info).workers;
    pAVar7 = pAVar3 + lVar4;
    pAVar3[lVar4].had_error = 0;
    if (lVar4 != 0) {
      lVar24 = (long)local_d088 * -0x38 + 0x38;
      lVar21 = (long)local_d088 * 0x38 + -0x40;
      do {
        (*pAVar6->launch)(pAVar7);
        lVar4 = lVar4 + -1;
        pAVar3 = (cpi->mt_info).workers;
        pAVar7 = pAVar3 + lVar4;
        *(undefined4 *)((long)&pAVar3->impl_ + lVar21) = 0;
        lVar24 = lVar24 + 0x38;
        lVar21 = lVar21 + -0x38;
      } while (lVar4 != 0);
      pAVar7 = (AVxWorker *)((long)pAVar3 - lVar24);
    }
    (*pAVar6->execute)(pAVar7);
  }
  pAVar6 = aom_get_worker_interface();
  pAVar7 = (cpi->mt_info).workers;
  iVar9 = pAVar7->had_error;
  if (iVar9 != 0) {
    memcpy(tg_buf_size,(void *)((long)pAVar7->data1 + 0x18),0x1a0);
  }
  if (1 < num_workers) {
    uVar22 = (long)local_d088 + 1;
    lVar4 = (long)local_d088 * 0x38;
    do {
      pAVar3 = (cpi->mt_info).workers;
      iVar16 = (*pAVar6->sync)((AVxWorker *)((long)&pAVar3[-1].impl_ + lVar4));
      if (iVar16 == 0) {
        memcpy(tg_buf_size,(void *)(*(long *)((long)&pAVar3[-1].data1 + lVar4) + 0x18),0x1a0);
        iVar9 = 1;
      }
      uVar22 = uVar22 - 1;
      lVar4 = lVar4 + -0x38;
    } while (2 < uVar22);
  }
  if (iVar9 != 0) {
    aom_internal_error_copy((cpi->common).error,(aom_internal_error_info *)tg_buf_size);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar7->data1 + 8) + 0x2b90) = (cpi->common).error;
  uVar20 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  tg_buf_size[0] = 0;
  tg_size_mi[0] = 1;
  if (0 < (int)uVar20) {
    local_d070 = (ulong)uVar20;
    piVar14 = &pack_bs_params[0].new_tg;
    uVar22 = 0;
    local_d098 = local_d080;
    lVar21 = 0;
    lVar4 = 0;
    do {
      if (*piVar14 != 0) {
        uVar20 = *local_d058;
        tg_buf_size[0] = (size_t)piVar14[-5];
        *tile_data_start = *tile_data_start + tg_buf_size[0];
        local_d098 = local_d080 + uVar20;
        *obu_header_size = piVar14[-6];
      }
      uVar13 = *(ulong *)(piVar14 + -0x11);
      iVar9 = piVar14[-1];
      tg_buf_size[0] = tg_buf_size[0] + uVar13 + (ulong)(iVar9 == 0) * 4;
      if (*max_tile_size < uVar13) {
        *largest_tile_id = (int)uVar22;
        *max_tile_size = (uint)uVar13;
      }
      uVar20 = (uint)uVar13 + **(uint32_t **)(piVar14 + -0xf);
      local_d08c = uVar20;
      if (uVar22 != 0) {
        memmove(local_d080 + lVar4,local_d080 + lVar21,(ulong)uVar20);
      }
      if (iVar9 != 0) {
        av1_write_last_tile_info
                  (cpi,local_d048,((PackBSParams *)(piVar14 + -0x15))->saved_wb,tg_buf_size,
                   local_d098,&local_d08c,tile_data_start,largest_tile_id,tg_size_mi,
                   *obu_header_size,*(uint8_t *)(piVar14 + -7));
        uVar20 = local_d08c;
      }
      lVar21 = lVar21 + *(size_t *)(piVar14 + -9);
      *local_d058 = *local_d058 + uVar20;
      lVar4 = lVar4 + (ulong)uVar20;
      uVar22 = uVar22 + 1;
      piVar14 = piVar14 + 0x16;
    } while (local_d070 != uVar22);
  }
  if (0 < num_workers) {
    uVar22 = (long)local_d088 + 1;
    lVar4 = (long)local_d088 * 0x1d0 + -0x1c8;
    do {
      av1_accumulate_pack_bs_thread_data
                (cpi,*(ThreadData **)
                      ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar4 + -0x20));
      uVar22 = uVar22 - 1;
      lVar4 = lVar4 + -0x1d0;
    } while (1 < uVar22);
  }
  return;
}

Assistant:

void av1_write_tile_obu_mt(
    AV1_COMP *const cpi, uint8_t *const dst, uint32_t *total_size,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extn_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id,
    unsigned int *max_tile_size, uint32_t *const obu_header_size,
    uint8_t **tile_data_start, const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  PackBSParams pack_bs_params[MAX_TILES];
  uint32_t tile_size[MAX_TILES] = { 0 };

  for (int tile_idx = 0; tile_idx < MAX_TILES; tile_idx++)
    pack_bs_params[tile_idx].total_size = &tile_size[tile_idx];

  init_tile_pack_bs_params(cpi, dst, saved_wb, pack_bs_params, obu_extn_header);
  prepare_pack_bs_workers(cpi, pack_bs_params, pack_bs_worker_hook,
                          num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
  accumulate_pack_bs_data(cpi, pack_bs_params, dst, total_size, fh_info,
                          largest_tile_id, max_tile_size, obu_header_size,
                          tile_data_start, num_workers);
}